

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O3

KaxReferenceBlock * __thiscall libmatroska::KaxBlockGroup::Reference(KaxBlockGroup *this,uint Index)

{
  KaxReferenceBlock *PastElt;
  
  PastElt = (KaxReferenceBlock *)
            libebml::EbmlMaster::FindFirstElt
                      (&this->super_EbmlMaster,(EbmlCallbacks *)KaxReferenceBlock::ClassInfos);
  if (PastElt == (KaxReferenceBlock *)0x0) {
    __assert_fail("MyBlockAdds != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                  ,0x346,
                  "const KaxReferenceBlock &libmatroska::KaxBlockGroup::Reference(unsigned int) const"
                 );
  }
  if (Index != 0) {
    do {
      PastElt = (KaxReferenceBlock *)
                libebml::EbmlMaster::FindNextElt(&this->super_EbmlMaster,(EbmlElement *)PastElt);
      if (PastElt == (KaxReferenceBlock *)0x0) {
        __assert_fail("MyBlockAdds != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                      ,0x34a,
                      "const KaxReferenceBlock &libmatroska::KaxBlockGroup::Reference(unsigned int) const"
                     );
      }
      Index = Index - 1;
    } while (Index != 0);
  }
  return PastElt;
}

Assistant:

const KaxReferenceBlock & KaxBlockGroup::Reference(unsigned int Index) const
{
  KaxReferenceBlock * MyBlockAdds = static_cast<KaxReferenceBlock *>(FindFirstElt(EBML_INFO(KaxReferenceBlock)));
  assert(MyBlockAdds != NULL); // call of a non existing reference

  while (Index != 0) {
    MyBlockAdds = static_cast<KaxReferenceBlock *>(FindNextElt(*MyBlockAdds));
    assert(MyBlockAdds != NULL);
    Index--;
  }
  return *MyBlockAdds;
}